

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AvxVarianceTest_Zero_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AvxVarianceTest_Zero_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x60);
  anon_unknown.dwarf_151d8d0::AvxVarianceTest_Zero_Test::AvxVarianceTest_Zero_Test
            ((AvxVarianceTest_Zero_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }